

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_surjectionproof_initialize
              (secp256k1_context *ctx,secp256k1_surjectionproof *proof,size_t *input_index,
              secp256k1_fixed_asset_tag *fixed_input_tags,size_t n_input_tags,
              size_t n_input_tags_to_use,secp256k1_fixed_asset_tag *fixed_output_tag,
              size_t n_max_iterations,uchar *random_seed32)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t next_input_index;
  size_t i;
  ulong uStack_70;
  int has_output_tag;
  size_t n_iterations;
  secp256k1_surjectionproof_csprng csprng;
  size_t n_input_tags_to_use_local;
  size_t n_input_tags_local;
  secp256k1_fixed_asset_tag *fixed_input_tags_local;
  size_t *input_index_local;
  secp256k1_surjectionproof *proof_local;
  secp256k1_context *ctx_local;
  
  uStack_70 = 0;
  csprng.state_i = n_input_tags_to_use;
  if (proof == (secp256k1_surjectionproof *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"proof != NULL");
  }
  else if (input_index == (size_t *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"input_index != NULL");
  }
  else if (fixed_input_tags == (secp256k1_fixed_asset_tag *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"fixed_input_tags != NULL");
  }
  else if (fixed_output_tag == (secp256k1_fixed_asset_tag *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"fixed_output_tag != NULL");
  }
  else if (random_seed32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"random_seed32 != NULL");
  }
  else if (n_input_tags < 0x101) {
    if (n_input_tags_to_use < 0x101) {
      if (n_input_tags < n_input_tags_to_use) {
        secp256k1_callback_call(&ctx->illegal_callback,"n_input_tags_to_use <= n_input_tags");
      }
      else {
        secp256k1_surjectionproof_csprng_init
                  ((secp256k1_surjectionproof_csprng *)&n_iterations,random_seed32);
        memset(proof->data,0,0x2020);
        proof->n_inputs = n_input_tags;
        do {
          bVar1 = false;
          memset(proof->used_inputs,0,0x20);
          for (next_input_index = 0; next_input_index < csprng.state_i;
              next_input_index = next_input_index + 1) {
            do {
              sVar3 = secp256k1_surjectionproof_csprng_next
                                ((secp256k1_surjectionproof_csprng *)&n_iterations,n_input_tags);
              iVar2 = memcmp(fixed_input_tags + sVar3,fixed_output_tag,0x20);
              if (iVar2 == 0) {
                *input_index = sVar3;
                bVar1 = true;
              }
            } while (((uint)proof->used_inputs[sVar3 >> 3] & 1 << ((byte)sVar3 & 7)) != 0);
            proof->used_inputs[sVar3 >> 3] =
                 proof->used_inputs[sVar3 >> 3] | (byte)(1 << ((byte)sVar3 & 7));
          }
          uStack_70 = uStack_70 + 1;
          if (bVar1) {
            return (int)uStack_70;
          }
        } while (uStack_70 < n_max_iterations);
      }
    }
    else {
      secp256k1_callback_call
                (&ctx->illegal_callback,
                 "n_input_tags_to_use <= SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS");
    }
  }
  else {
    secp256k1_callback_call
              (&ctx->illegal_callback,"n_input_tags <= SECP256K1_SURJECTIONPROOF_MAX_N_INPUTS");
  }
  return 0;
}

Assistant:

int secp256k1_surjectionproof_initialize(const secp256k1_context* ctx, secp256k1_surjectionproof* proof, size_t *input_index, const secp256k1_fixed_asset_tag* fixed_input_tags, const size_t n_input_tags, const size_t n_input_tags_to_use, const secp256k1_fixed_asset_tag* fixed_output_tag, const size_t n_max_iterations, const unsigned char *random_seed32) {
    secp256k1_surjectionproof_csprng csprng;
    size_t n_iterations = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(proof != NULL);
    ARG_CHECK(input_index != NULL);
    ARG_CHECK(fixed_input_tags != NULL);
    ARG_CHECK(fixed_output_tag != NULL);
    ARG_CHECK(random_seed32 != NULL);
    ARG_CHECK(n_input_tags <= SECP256K1_SURJECTIONPROOF_MAX_N_INPUTS);
    ARG_CHECK(n_input_tags_to_use <= SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS);
    ARG_CHECK(n_input_tags_to_use <= n_input_tags);
    (void) ctx;

    secp256k1_surjectionproof_csprng_init(&csprng, random_seed32);
    memset(proof->data, 0, sizeof(proof->data));
    proof->n_inputs = n_input_tags;

    while (1) {
        int has_output_tag = 0;
        size_t i;

        /* obtain a random set of indices */
        memset(proof->used_inputs, 0, sizeof(proof->used_inputs));
        for (i = 0; i < n_input_tags_to_use; i++) {
            while (1) {
                size_t next_input_index;
                next_input_index = secp256k1_surjectionproof_csprng_next(&csprng, n_input_tags);
                if (memcmp(&fixed_input_tags[next_input_index], fixed_output_tag, sizeof(*fixed_output_tag)) == 0) {
                    *input_index = next_input_index;
                    has_output_tag = 1;
                }

                if (!(proof->used_inputs[next_input_index / 8] & (1 << (next_input_index  % 8)))) {
                    proof->used_inputs[next_input_index / 8] |= (1 << (next_input_index % 8));
                    break;
                }
            }
        }

        /* Check if we succeeded */
        n_iterations++;
        if (has_output_tag) {
#ifdef VERIFY
            proof->initialized = 1;
#endif
            return n_iterations;
        }
        if (n_iterations >= n_max_iterations) {
#ifdef VERIFY
            proof->initialized = 0;
#endif
            return 0;
        }
    }
}